

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator|=
          (CharClass<unsigned_char> *this,CharClass<unsigned_char> *cc)

{
  CharClass<unsigned_char> *pCVar1;
  CharClass<unsigned_char> local_38;
  CharClass<unsigned_char> *local_18;
  CharClass<unsigned_char> *cc_local;
  CharClass<unsigned_char> *this_local;
  
  local_18 = cc;
  cc_local = this;
  operator|(&local_38,this,cc);
  pCVar1 = operator=(this,&local_38);
  ~CharClass(&local_38);
  return pCVar1;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }